

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

Spectrum __thiscall CMU462::PathTracer::raytrace_pixel(PathTracer *this,size_t x,size_t y)

{
  Spectrum SVar1;
  Ray local_b8;
  undefined1 local_48 [8];
  Vector2D p;
  int num_samples;
  size_t y_local;
  size_t x_local;
  PathTracer *this_local;
  
  p.y._4_4_ = (undefined4)this->ns_aa;
  Vector2D::Vector2D((Vector2D *)local_48,0.5,0.5);
  Camera::generate_ray(&local_b8,this->camera,(double)local_48,p.x);
  SVar1 = trace_ray(this,&local_b8);
  return SVar1;
}

Assistant:

Spectrum PathTracer::raytrace_pixel(size_t x, size_t y) {

    // TODO:
    // Sample the pixel with coordinate (x,y) and return the result spectrum.
    // The sample rate is given by the number of camera rays per pixel.

    int num_samples = ns_aa;

    Vector2D p = Vector2D(0.5,0.5);
    return trace_ray(camera->generate_ray(p.x, p.y));

  }